

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseMinimizer.cpp
# Opt level: O1

void __thiscall TraverseMinimizer::dfs(TraverseMinimizer *this,Node *node)

{
  pointer *pppNVar1;
  long *plVar2;
  pointer ppNVar3;
  deque<Node*,std::allocator<Node*>> *this_00;
  long lVar4;
  size_t __n;
  pointer __dest;
  long *plVar5;
  Node *neighbor;
  Node *local_38;
  
  this_00 = (deque<Node*,std::allocator<Node*>> *)operator_new(0x50);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)(this_00 + 0x18) = 0;
  *(undefined8 *)(this_00 + 0x20) = 0;
  *(undefined8 *)(this_00 + 0x28) = 0;
  *(undefined8 *)(this_00 + 0x30) = 0;
  *(undefined8 *)(this_00 + 0x38) = 0;
  *(undefined8 *)(this_00 + 0x40) = 0;
  *(undefined8 *)(this_00 + 0x48) = 0;
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::_M_initialize_map
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)this_00,0);
  local_38 = node;
  if (*(undefined8 **)(this_00 + 0x30) == (undefined8 *)(*(long *)(this_00 + 0x40) + -8)) {
    std::deque<Node*,std::allocator<Node*>>::_M_push_back_aux<Node*>(this_00,&local_38);
  }
  else {
    **(undefined8 **)(this_00 + 0x30) = node;
    *(long *)(this_00 + 0x30) = *(long *)(this_00 + 0x30) + 8;
  }
  lVar4 = *(long *)(this_00 + 0x30);
  if (lVar4 != *(long *)(this_00 + 0x10)) {
    do {
      if (lVar4 == *(long *)(this_00 + 0x38)) {
        lVar4 = *(long *)(*(long *)(this_00 + 0x48) + -8) + 0x200;
      }
      lVar4 = *(long *)(lVar4 + -8);
      std::deque<Node_*,_std::allocator<Node_*>_>::pop_back
                ((deque<Node_*,_std::allocator<Node_*>_> *)this_00);
      if (*(char *)(lVar4 + 9) == '\0') {
        *(undefined1 *)(lVar4 + 9) = 1;
        plVar2 = *(long **)(lVar4 + 0x18);
        for (plVar5 = *(long **)(lVar4 + 0x10); plVar5 != plVar2; plVar5 = plVar5 + 1) {
          local_38 = (Node *)*plVar5;
          if (local_38->marked == true) {
            __dest = (this->startingPoints).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            ppNVar3 = (this->startingPoints).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (__dest != ppNVar3) {
              __n = (long)ppNVar3 - (long)__dest;
              do {
                __n = __n - 8;
                if (*__dest == local_38) {
                  local_38->marked = false;
                  if (__dest + 1 != ppNVar3) {
                    memmove(__dest,__dest + 1,__n);
                  }
                  pppNVar1 = &(this->startingPoints).
                              super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppNVar1 = *pppNVar1 + -1;
                  break;
                }
                __dest = __dest + 1;
              } while (__dest != ppNVar3);
            }
          }
          else if (local_38->visited == false) {
            if (*(long **)(this_00 + 0x30) == (long *)(*(long *)(this_00 + 0x40) + -8)) {
              std::deque<Node*,std::allocator<Node*>>::_M_push_back_aux<Node*const&>
                        (this_00,&local_38);
            }
            else {
              **(long **)(this_00 + 0x30) = (long)local_38;
              *(long *)(this_00 + 0x30) = *(long *)(this_00 + 0x30) + 8;
            }
          }
        }
      }
      lVar4 = *(long *)(this_00 + 0x30);
    } while (lVar4 != *(long *)(this_00 + 0x10));
  }
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void TraverseMinimizer::dfs(Node& node) {
    auto pile = new std::stack<Node*>;
    pile->push(&node);

    while (!pile->empty()) {
        auto v = pile->top();
        pile->pop();

        if (v->visited) continue;
        v->visited = true;

        for (auto neighbor : v->neighbors) {
            if (neighbor->marked) {
                removeMark(*neighbor);
                continue;
            }
            if (neighbor->visited) continue;
            pile->push(neighbor);
        }
    }
    delete pile;
}